

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_decoder.h
# Opt level: O1

LumaFrame * __thiscall LumaDecoder::decode(LumaDecoder *this)

{
  vpx_image_t *pvVar1;
  int iVar2;
  LumaFrame *this_00;
  EVP_PKEY_CTX *in_RSI;
  
  iVar2 = (*(this->super_LumaDecoderBase)._vptr_LumaDecoderBase[1])();
  if ((char)iVar2 == '\0') {
    this_00 = (LumaFrame *)0x0;
  }
  else {
    this_00 = &(this->super_LumaDecoderBase).m_frame;
    if ((this->super_LumaDecoderBase).m_frame.width == 0) {
      pvVar1 = this->m_vpxFrame;
      (this->super_LumaDecoderBase).m_frame.width = pvVar1->d_w;
      (this->super_LumaDecoderBase).m_frame.height = pvVar1->d_h;
      (this->super_LumaDecoderBase).m_frame.channels = 3;
      LumaFrame::init(this_00,in_RSI);
    }
    getVpxChannels(this);
    LumaQuantizer::transformColorSpace
              (&(this->super_LumaDecoderBase).m_quant,this_00,false,
               (this->m_params).super_LumaDecoderParamsBase.preScaling);
  }
  return this_00;
}

Assistant:

LumaFrame *decode()
    {
        if (!run())
            return NULL;
            
        if (!m_frame.width)
        {
            m_frame.width = m_vpxFrame->d_w;
            m_frame.height = m_vpxFrame->d_h;
            m_frame.channels = 3;
            m_frame.init();
        }
        
	    getVpxChannels();
        
        m_quant.transformColorSpace(&m_frame, false, m_params.preScaling);
        
        return &m_frame;
    }